

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall DPlayerMenu::ClassChanged(DPlayerMenu *this,FListMenuItem *li)

{
  int iVar1;
  uint uVar2;
  FListMenuItem *pFVar3;
  char *val;
  int sel;
  undefined8 local_28;
  
  if (PlayerClasses.Count != 1) {
    local_28 = &PlayerClasses;
    iVar1 = (*li->_vptr_FListMenuItem[0xb])(li,0,&local_28);
    if ((char)iVar1 != '\0') {
      userinfo_t::PlayerClassNumChanged
                ((userinfo_t *)(&DAT_009ba458 + (long)consoleplayer * 0x2a0),
                 (int)local_28 - (gameinfo.norandomplayerclass ^ 1));
      PickPlayerClass(this);
      if (((int)local_28 == 0) && (gameinfo.norandomplayerclass != true)) {
        val = "Random";
      }
      else {
        val = (this->PlayerClass->Type->DisplayName).Chars;
      }
      cvar_set("playerclass",val);
      UpdateSkins(this);
      UpdateColorsets(this);
      UpdateTranslation(this);
      local_28 = (TArray<FPlayerClass,_FPlayerClass> *)CONCAT44(0x1ee,(int)local_28);
      pFVar3 = DListMenu::GetItem(&this->super_DListMenu,(FName *)((long)&local_28 + 4));
      if (pFVar3 != (FListMenuItem *)0x0) {
        uVar2 = userinfo_t::GetPlayerClassNum
                          ((userinfo_t *)(&DAT_009ba458 + (long)consoleplayer * 0x2a0));
        (*pFVar3->_vptr_FListMenuItem[10])(pFVar3,0x10003,(ulong)uVar2);
      }
    }
  }
  return;
}

Assistant:

unsigned int Size () const
	{
		return Count;
	}